

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_progress_reporter.cpp
# Opt level: O3

double __thiscall ON_ProgressStepCounter::Progress(ON_ProgressStepCounter *this)

{
  uint uVar1;
  double dVar2;
  
  uVar1 = this->m_step_index;
  if (uVar1 == 0) {
    return this->m_progress_interval_start;
  }
  if (uVar1 < this->m_step_count) {
    dVar2 = (double)uVar1 / (double)this->m_step_count;
    return (1.0 - dVar2) * this->m_progress_interval_start +
           dVar2 * this->m_progress_interval_finish;
  }
  return this->m_progress_interval_finish;
}

Assistant:

double ON_ProgressStepCounter::Progress() const
{
  if (m_step_index <= 0)
    return m_progress_interval_start;
  if (m_step_index >= m_step_count)
    return m_progress_interval_finish;
  const double s = ((double)m_step_index)/((double)m_step_count);
  return (1.0 - s)*m_progress_interval_start + s*m_progress_interval_finish;
}